

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  bool bVar2;
  int in_EAX;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  
  do {
    lVar6 = (long)end - (long)ptr;
    if (lVar6 < 2) {
      return -1;
    }
    bVar1 = ((byte *)ptr)[1];
    if (bVar1 < 0xdc) {
      uVar5 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        }
        else {
LAB_00760b05:
          uVar5 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar5 = 8;
    }
    else if ((bVar1 != 0xff) || (uVar5 = 0, (byte)*ptr < 0xfe)) goto LAB_00760b05;
    switch(uVar5) {
    case 0:
    case 1:
    case 8:
      *nextTokPtr = ptr;
      in_EAX = 0;
      break;
    default:
      pbVar4 = (byte *)ptr + 2;
      goto LAB_00760b94;
    case 6:
      if (lVar6 != 2) {
        pbVar4 = (byte *)ptr + 3;
        goto LAB_00760b94;
      }
LAB_00760b80:
      in_EAX = -2;
      bVar2 = false;
      pbVar4 = (byte *)ptr;
      goto LAB_00760b99;
    case 7:
      if (lVar6 < 4) goto LAB_00760b80;
      pbVar4 = (byte *)ptr + 4;
LAB_00760b94:
      bVar2 = true;
      goto LAB_00760b99;
    case 0xc:
    case 0xd:
      pbVar4 = (byte *)ptr + 2;
      bVar2 = true;
      if (uVar5 != open) goto LAB_00760b99;
      if ((long)end - (long)pbVar4 < 2) {
        in_EAX = -0x1b;
        ptr = (char *)pbVar4;
      }
      else {
        *nextTokPtr = (char *)pbVar4;
        bVar1 = ((byte *)ptr)[3];
        if (bVar1 < 0xdc) {
          bVar3 = 7;
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar4);
            }
            else {
LAB_00760bc6:
              bVar3 = 0x1d;
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          bVar3 = 8;
        }
        else {
          if ((bVar1 != 0xff) || (*pbVar4 < 0xfe)) goto LAB_00760bc6;
          bVar3 = 0;
        }
        ptr = (char *)pbVar4;
        in_EAX = 0;
        if ((bVar3 < 0x1f) && (in_EAX = 0, (0x40300e00U >> (bVar3 & 0x1f) & 1) != 0)) {
          in_EAX = 0x1b;
        }
      }
    }
    bVar2 = false;
    pbVar4 = (byte *)ptr;
LAB_00760b99:
    ptr = (char *)pbVar4;
    if (!bVar2) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
      INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
      case BT_GT:
      case BT_PERCNT:
      case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}